

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_2.cpp
# Opt level: O0

int evaluate(int a,int b,char op)

{
  ostream *poVar1;
  char op_local;
  int b_local;
  int a_local;
  
  switch(op) {
  case '*':
    b_local = a * b;
    break;
  case '+':
    b_local = a + b;
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"Oh noez! I do not know this operator. ");
    poVar1 = std::operator<<(poVar1,op);
    std::operator<<(poVar1,'\n');
    goto LAB_0010248e;
  case '-':
    b_local = a - b;
    break;
  case '/':
    if (b != 0) {
      return a / b;
    }
    std::operator<<((ostream *)&std::cerr,"Oh, you cannot device by 0\n");
LAB_0010248e:
    b_local = 0;
  }
  return b_local;
}

Assistant:

int evaluate(int a, int b, char op)
{
	switch (op)
	{
		case '+':
			return a + b;
		case '-':
			return a - b;
		case '*':
			return a * b;
		case '/':
			if (b != 0)
				return a / b;
			cerr << "Oh, you cannot device by 0\n";
			break;
		default:
			cerr << "Oh noez! I do not know this operator. " << op << '\n';
			break;
	}
	return 0; // failure case
}